

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  ostream *poVar1;
  bool bVar2;
  char *str;
  char *in_RDX;
  Int32 IVar3;
  _Alloc_hider _Var4;
  Int32 result;
  string env_var;
  Int32 local_74;
  Message local_70;
  string local_68;
  string local_48;
  
  FlagToEnvVar_abi_cxx11_(&local_68,(internal *)flag,in_RDX);
  _Var4._M_p = local_68._M_dataplus._M_p;
  str = getenv(local_68._M_dataplus._M_p);
  IVar3 = default_value;
  if (str != (char *)0x0) {
    local_74 = default_value;
    Message::Message((Message *)&local_48);
    _Var4._M_p = local_48._M_dataplus._M_p;
    poVar1 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
    bVar2 = ParseInt32((Message *)&local_48,str,&local_74);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var4._M_p + 8))(_Var4._M_p);
    }
    _Var4._M_p = local_68._M_dataplus._M_p;
    IVar3 = local_74;
    if (!bVar2) {
      Message::Message(&local_70);
      std::ostream::operator<<((ostream *)((long)local_70.ss_.ptr_ + 0x10),default_value);
      StringStreamToString(&local_48,(stringstream *)local_70.ss_.ptr_);
      printf("The default value %s is used.\n",local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_70.ss_.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70.ss_.ptr_ + 8))(local_70.ss_.ptr_);
      }
      fflush(_stdout);
      _Var4._M_p = local_68._M_dataplus._M_p;
      IVar3 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &local_68.field_2) {
    operator_delete(_Var4._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return IVar3;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}